

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O0

void StoreCommands(BrotliTwoPassArena *s,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  ulong uVar5;
  ulong in_RDX;
  byte *in_RSI;
  void *in_RDI;
  ulong in_R8;
  ulong *in_R9;
  uint8_t *in_stack_00000008;
  uint8_t lit;
  uint32_t j;
  uint32_t insert;
  uint32_t extra;
  uint32_t code_1;
  uint32_t cmd;
  uint32_t code;
  size_t i;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  size_t *in_stack_00000520;
  uint8_t *in_stack_00000528;
  uint8_t *storage_00;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar6;
  undefined4 in_stack_fffffffffffffef4;
  ulong local_f8;
  byte *local_d0;
  uint16_t *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  uint32_t *in_stack_ffffffffffffffa8;
  HuffmanTree *in_stack_ffffffffffffffb0;
  
  memset(in_RDI,0,0x400);
  memset((void *)((long)in_RDI + 0x900),0,0x80);
  memset((void *)((long)in_RDI + 0x980),0,0x100);
  memset((void *)((long)in_RDI + 0x700),0,0x200);
  for (local_f8 = 0; local_f8 < in_RDX; local_f8 = local_f8 + 1) {
    *(int *)((long)in_RDI + (ulong)in_RSI[local_f8] * 4) =
         *(int *)((long)in_RDI + (ulong)in_RSI[local_f8] * 4) + 1;
  }
  storage_00 = in_stack_00000008;
  duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_00000520,in_stack_00000528);
  for (local_f8 = 0; local_f8 < in_R8; local_f8 = local_f8 + 1) {
    uVar5 = (ulong)(*(uint *)(in_RCX + local_f8 * 4) & 0xff);
    *(int *)((long)in_RDI + uVar5 * 4 + 0x700) = *(int *)((long)in_RDI + uVar5 * 4 + 0x700) + 1;
  }
  *(int *)((long)in_RDI + 0x704) = *(int *)((long)in_RDI + 0x704) + 1;
  *(int *)((long)in_RDI + 0x708) = *(int *)((long)in_RDI + 0x708) + 1;
  *(int *)((long)in_RDI + 0x800) = *(int *)((long)in_RDI + 0x800) + 1;
  *(int *)((long)in_RDI + 0x850) = *(int *)((long)in_RDI + 0x850) + 1;
  BuildAndStoreCommandPrefixCode
            ((BrotliTwoPassArena *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (size_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),storage_00);
  local_d0 = in_RSI;
  for (local_f8 = 0; local_f8 < in_R8; local_f8 = local_f8 + 1) {
    uVar4 = *(uint *)(in_RCX + local_f8 * 4);
    uVar3 = uVar4 & 0xff;
    uVar4 = uVar4 >> 8;
    bVar1 = *(byte *)((long)in_RDI + (ulong)uVar3 + 0x900);
    *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
         (ulong)*(ushort *)((long)in_RDI + (ulong)uVar3 * 2 + 0x980) << ((byte)*in_R9 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
    *in_R9 = (ulong)bVar1 + *in_R9;
    uVar6 = StoreCommands::kNumExtraBits[uVar3];
    *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
         (ulong)uVar4 << ((byte)*in_R9 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
    *in_R9 = (ulong)uVar6 + *in_R9;
    if (uVar3 < 0x18) {
      uVar2 = StoreCommands::kInsertOffset[uVar3];
      for (uVar6 = 0; uVar6 < uVar2 + uVar4; uVar6 = uVar6 + 1) {
        bVar1 = *(byte *)((long)in_RDI + (ulong)*local_d0 + 0x400);
        *(ulong *)(in_stack_00000008 + (*in_R9 >> 3)) =
             (ulong)*(ushort *)((long)in_RDI + (ulong)*local_d0 * 2 + 0x500) << ((byte)*in_R9 & 7) |
             (ulong)(byte)*(ulong *)(in_stack_00000008 + (*in_R9 >> 3));
        *in_R9 = (ulong)bVar1 + *in_R9;
        local_d0 = local_d0 + 1;
      }
    }
  }
  return;
}

Assistant:

static void StoreCommands(BrotliTwoPassArena* s,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
      0,  0,  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,  5,  5,
      6,  7,  8,  9,  10, 12, 14, 24, 0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  5,  5,  6,  7,  8,  9,  10, 24,
      0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  5,  5,  6,  6,  7,  7,  8,  8,
      9,  9,  10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
      0,  1,  2,  3,  4,   5,   6,   8,   10,   14,   18,   26,
      34, 50, 66, 98, 130, 194, 322, 578, 1090, 2114, 6210, 22594,
  };

  size_t i;
  memset(s->lit_histo, 0, sizeof(s->lit_histo));
  /* TODO(eustas): is that necessary? */
  memset(s->cmd_depth, 0, sizeof(s->cmd_depth));
  /* TODO(eustas): is that necessary? */
  memset(s->cmd_bits, 0, sizeof(s->cmd_bits));
  memset(s->cmd_histo, 0, sizeof(s->cmd_histo));
  for (i = 0; i < num_literals; ++i) {
    ++s->lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(s->tmp_tree, s->lit_histo, num_literals,
                                     /* max_bits = */ 8, s->lit_depth,
                                     s->lit_bits, storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++s->cmd_histo[code];
  }
  s->cmd_histo[1] += 1;
  s->cmd_histo[2] += 1;
  s->cmd_histo[64] += 1;
  s->cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(s, storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(s->cmd_depth[code], s->cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(s->lit_depth[lit], s->lit_bits[lit], storage_ix,
                        storage);
        ++literals;
      }
    }
  }
}